

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_table_clone(amqp_table_t *original,amqp_table_t *clone,amqp_pool_t *pool)

{
  int iVar1;
  void *pvVar2;
  amqp_table_entry_t *in_RDX;
  amqp_pool_t *in_RSI;
  undefined4 *in_RDI;
  int res;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int local_4;
  
  *(undefined4 *)&in_RSI->pagesize = *in_RDI;
  if ((int)in_RSI->pagesize == 0) {
    in_RSI->pagesize = 0;
    *(amqp_table_entry_t_ **)&in_RSI->pages = (amqp_table_entry_t_ *)0x0;
    local_4 = 0;
  }
  else {
    pvVar2 = amqp_pool_alloc(in_RSI,(size_t)in_RDX);
    *(void **)&in_RSI->pages = pvVar2;
    if (*(long *)&in_RSI->pages == 0) {
      local_4 = -1;
    }
    else {
      for (iVar3 = 0; iVar3 < (int)in_RSI->pagesize; iVar3 = iVar3 + 1) {
        iVar1 = amqp_table_entry_clone
                          ((amqp_table_entry_t *)in_RSI,in_RDX,
                           (amqp_pool_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
        if (iVar1 != 0) {
          return iVar1;
        }
        in_stack_ffffffffffffffd8 = 0;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int amqp_table_clone(const amqp_table_t *original, amqp_table_t *clone,
                     amqp_pool_t *pool) {
  int i;
  int res;
  clone->num_entries = original->num_entries;
  if (0 == clone->num_entries) {
    *clone = amqp_empty_table;
    return AMQP_STATUS_OK;
  }

  clone->entries =
      amqp_pool_alloc(pool, clone->num_entries * sizeof(amqp_table_entry_t));

  if (NULL == clone->entries) {
    return AMQP_STATUS_NO_MEMORY;
  }

  for (i = 0; i < clone->num_entries; ++i) {
    res =
        amqp_table_entry_clone(&original->entries[i], &clone->entries[i], pool);
    if (AMQP_STATUS_OK != res) {
      goto error_out1;
    }
  }

  return AMQP_STATUS_OK;

error_out1:
  return res;
}